

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::js::api::json::CreateExtkeyFromParentPathRequest::CreateExtkeyFromParentPathRequest
          (CreateExtkeyFromParentPathRequest *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  
  (this->super_JsonClassBase<cfd::js::api::json::CreateExtkeyFromParentPathRequest>).
  _vptr_JsonClassBase = (_func_int **)&PTR__CreateExtkeyFromParentPathRequest_00b3a170;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&this->extkey_,"",&local_31);
  std::__cxx11::string::string((string *)&this->network_,"mainnet",&local_32);
  std::__cxx11::string::string((string *)&this->extkey_type_,"",&local_33);
  (this->child_number_array_).super_JsonVector<unsigned_int>.
  super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->child_number_array_).super_JsonVector<unsigned_int>.
  super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->child_number_array_).super_JsonVector<unsigned_int>.
  super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->child_number_array_).super_JsonVector<unsigned_int>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00b3a208;
  std::__cxx11::string::string((string *)&this->path_,"",&local_34);
  CollectFieldName();
  return;
}

Assistant:

CreateExtkeyFromParentPathRequest() {
    CollectFieldName();
  }